

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O2

void Cgt_SimulationRecord(Cgt_Man_t *p)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  Vec_Ptr_t *p_00;
  int i;
  long lVar6;
  
  lVar6 = 0;
  do {
    pVVar2 = p->pPart->vObjs;
    if (pVVar2->nSize <= lVar6) {
      iVar3 = p->nPatts + 1;
      p->nPatts = iVar3;
      if (iVar3 == p->nPattWords << 5) {
        pVVar2 = p->vPatts;
        if (pVVar2->nSize < 2) {
          __assert_fail("Vec_PtrSize(vInfo) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x456,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
        }
        pvVar4 = Vec_PtrEntry(pVVar2,1);
        pvVar5 = Vec_PtrEntry(pVVar2,0);
        iVar3 = (int)((ulong)((long)pvVar4 - (long)pvVar5) >> 2);
        p_00 = Vec_PtrAllocSimInfo(pVVar2->nSize,iVar3 * 2);
        for (i = 0; i < pVVar2->nSize; i = i + 1) {
          pvVar4 = Vec_PtrEntry(p_00,i);
          pvVar5 = Vec_PtrEntry(pVVar2,i);
          memcpy(pvVar4,pvVar5,(long)(iVar3 << 2));
        }
        free(pVVar2->pArray);
        pVVar2->pArray = p_00->pArray;
        free(p_00);
        Vec_PtrCleanSimInfo(p->vPatts,p->nPattWords,p->nPattWords * 2);
        p->nPattWords = p->nPattWords << 1;
      }
      return;
    }
    pvVar4 = Vec_PtrEntry(pVVar2,(int)lVar6);
    if (pvVar4 != (void *)0x0) {
      iVar3 = p->pCnf->pVarNums[lVar6];
      if (((long)iVar3 < 0) || (p->pSat->size <= iVar3)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (p->pSat->model[iVar3] == 1) {
        pvVar4 = Vec_PtrEntry(p->vPatts,(int)lVar6);
        puVar1 = (uint *)((long)pvVar4 + (long)(p->nPatts >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)p->nPatts & 0x1f);
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Cgt_SimulationRecord( Cgt_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pPart, pObj, i )
        if ( sat_solver_var_value( p->pSat, p->pCnf->pVarNums[i] ) )
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPatts, i), p->nPatts );
    p->nPatts++;
    if ( p->nPatts == 32 * p->nPattWords )
    {
        Vec_PtrReallocSimInfo( p->vPatts );
        Vec_PtrCleanSimInfo( p->vPatts, p->nPattWords, 2 * p->nPattWords );
        p->nPattWords *= 2;
    }
}